

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O1

bool TestComparisonsF<Counter<unsigned_char,8u>>(void)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  uint ii;
  int iVar8;
  char cVar9;
  bool bVar10;
  
  bVar10 = false;
  cVar1 = -1;
  cVar2 = '\x01';
  cVar4 = -0x17;
  uVar5 = 0;
  do {
    uVar6 = uVar5 + 1;
    iVar8 = 0;
    do {
      cVar7 = (char)iVar8;
      cVar9 = cVar2 + cVar7;
      if (-1 < (char)((cVar1 + cVar7) - cVar9 & cVar7 - cVar9)) {
        return bVar10;
      }
      if ((char)(cVar9 - (cVar1 + cVar7)) < '\0') {
        return bVar10;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 1000);
    cVar7 = cVar1 + -0x18;
    iVar8 = 0;
    do {
      cVar9 = (char)iVar8 + -0x18;
      if (cVar9 == cVar7) {
        return bVar10;
      }
      cVar3 = cVar4 + (char)iVar8;
      if (cVar3 == cVar7) {
        return bVar10;
      }
      if (-1 < (char)-(cVar9 - cVar7)) {
        return bVar10;
      }
      if (-1 < (char)(cVar9 - cVar3 & cVar7 - cVar3)) {
        return bVar10;
      }
      if ((char)(cVar9 - cVar7) < '\0') {
        return bVar10;
      }
      if ((char)(cVar3 - cVar7) < '\0') {
        return bVar10;
      }
      cVar7 = cVar7 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar8 != -2000);
    bVar10 = 1 < uVar5;
    cVar1 = cVar1 + -1;
    cVar2 = cVar2 + '\x01';
    cVar4 = cVar4 + '\x01';
    uVar5 = uVar6;
    if (uVar6 == 3) {
      return bVar10;
    }
  } while( true );
}

Assistant:

bool TestComparisonsF()
{
    CounterT a = 2, b = 2, c = 3;
    TEST_CHECK(a == b);
    TEST_CHECK(b != c);
    b = c;
    TEST_CHECK(b == c);
    TEST_CHECK(a != b);

    for (unsigned sep = 0; sep < 3; ++sep)
    {
        a = CounterT::kMask - sep;
        b = 0;
        c = 1 + sep;

        for (unsigned ii = 0; ii < 1000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a++;
            ++b;
            c++;
        }

        for (unsigned ii = 0; ii < 2000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a--;
            --b;
            c--;
        }
    }

    return true;
}